

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP5Serializer::ValidateWriterRec
          (BP5Serializer *this,BP5WriterRec Rec,void *Variable)

{
  long *plVar1;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  size_t __n;
  int iVar5;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool bVar8;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Rec->Key = Variable;
  plVar1 = *(long **)((long)Variable + 0xd8);
  plVar2 = *(long **)((long)Variable + 0xe0);
  if (plVar2 == plVar1) {
    if (Rec->OperatorType == (char *)0x0) {
      if (plVar2 != plVar1) goto LAB_00624bcc;
      goto LAB_00624bd7;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Toolkit","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"format::BP5Serializer","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Marshal","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"BP5 does not support removing operators after the first Put()",
               "");
    helper::Throw<std::logic_error>(&local_70,&local_90,&local_b0,&local_d0,-1);
  }
  else {
LAB_00624bcc:
    if (Rec->OperatorType == (char *)0x0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Toolkit","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"format::BP5Serializer","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Marshal","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"BP5 does not support adding operators after the first Put()",
                 "");
      helper::Throw<std::logic_error>(&local_70,&local_90,&local_b0,&local_d0,-1);
    }
    else {
LAB_00624bd7:
      if ((ulong)((long)plVar2 - (long)plVar1) < 0x11) {
        pcVar3 = Rec->OperatorType;
        if (pcVar3 == (char *)0x0 || plVar2 == plVar1) {
LAB_00624e87:
          bVar8 = false;
        }
        else {
          lVar4 = *plVar1;
          std::__cxx11::string::string((string *)&local_70,pcVar3,&local_d1);
          __n = *(size_t *)(lVar4 + 0x10);
          bVar8 = true;
          if (__n == local_70._M_string_length) {
            if (__n == 0) goto LAB_00624e87;
            iVar5 = bcmp(*(void **)(lVar4 + 8),local_70._M_dataplus._M_p,__n);
            bVar8 = iVar5 != 0;
          }
        }
        if ((pcVar3 != (char *)0x0 && plVar2 != plVar1) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2)) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (!bVar8) {
          return;
        }
        paVar7 = &local_90.field_2;
        local_90._M_dataplus._M_p = (pointer)paVar7;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Toolkit","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"format::BP5Serializer","");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Marshal","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "BP5 does not support changing operators after the first Put()","");
        helper::Throw<std::logic_error>(&local_90,&local_b0,&local_d0,&local_50,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        _Var6._M_p = local_90._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
          _Var6._M_p = local_90._M_dataplus._M_p;
        }
        goto LAB_00624e14;
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Toolkit","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"format::BP5Serializer","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Marshal","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"BP5 does not support multiple operators","");
      helper::Throw<std::logic_error>(&local_70,&local_90,&local_b0,&local_d0,-1);
    }
  }
  paVar7 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  _Var6._M_p = local_70._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
    _Var6._M_p = local_70._M_dataplus._M_p;
  }
LAB_00624e14:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p != paVar7) {
    operator_delete(_Var6._M_p);
  }
  return;
}

Assistant:

void BP5Serializer::ValidateWriterRec(BP5Serializer::BP5WriterRec Rec, void *Variable)
{
    core::VariableBase *VB = static_cast<core::VariableBase *>(Variable);

    Rec->Key = Variable; // reset this, because Variable might have been destroyed and recreated
    if ((VB->m_Operations.size() == 0) && Rec->OperatorType)
    {
        // removed operator case
        helper::Throw<std::logic_error>(
            "Toolkit", "format::BP5Serializer", "Marshal",
            "BP5 does not support removing operators after the first Put()");
    }
    else if ((VB->m_Operations.size() > 0) && !Rec->OperatorType)
    {
        // removed operator case
        helper::Throw<std::logic_error>(
            "Toolkit", "format::BP5Serializer", "Marshal",
            "BP5 does not support adding operators after the first Put()");
    }
    else if (VB->m_Operations.size() > 1)
    {
        // removed operator case
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer", "Marshal",
                                        "BP5 does not support multiple operators");
    }
    else if (Rec->OperatorType && VB->m_Operations.size() &&
             (VB->m_Operations[0]->m_TypeString != std::string(Rec->OperatorType)))
    {
        // removed operator case
        helper::Throw<std::logic_error>(
            "Toolkit", "format::BP5Serializer", "Marshal",
            "BP5 does not support changing operators after the first Put()");
    }
}